

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

void emit_restart(j_compress_ptr cinfo,int restart_num)

{
  long lVar1;
  long in_RDI;
  jpeg_component_info *compptr;
  int ci;
  arith_entropy_ptr entropy;
  j_compress_ptr in_stack_ffffffffffffffd8;
  long lVar2;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int iVar3;
  
  lVar1 = *(long *)(in_RDI + 0x230);
  finish_pass((j_compress_ptr)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  emit_byte(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8);
  emit_byte(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8);
  for (iVar3 = 0; iVar3 < *(int *)(in_RDI + 0x170); iVar3 = iVar3 + 1) {
    lVar2 = *(long *)(in_RDI + 0x178 + (long)iVar3 * 8);
    if ((*(int *)(in_RDI + 0x1cc) == 0) && (*(int *)(in_RDI + 0x1d4) == 0)) {
      memset(*(void **)(lVar1 + 0x68 + (long)*(int *)(lVar2 + 0x14) * 8),0,0x40);
      *(undefined4 *)(lVar1 + 0x40 + (long)iVar3 * 4) = 0;
      *(undefined4 *)(lVar1 + 0x50 + (long)iVar3 * 4) = 0;
    }
    if (*(int *)(in_RDI + 0x1d0) != 0) {
      memset(*(void **)(lVar1 + 0xe8 + (long)*(int *)(lVar2 + 0x18) * 8),0,0x100);
    }
  }
  *(undefined8 *)(lVar1 + 0x18) = 0;
  *(undefined8 *)(lVar1 + 0x20) = 0x10000;
  *(undefined8 *)(lVar1 + 0x28) = 0;
  *(undefined8 *)(lVar1 + 0x30) = 0;
  *(undefined4 *)(lVar1 + 0x38) = 0xb;
  *(undefined4 *)(lVar1 + 0x3c) = 0xffffffff;
  return;
}

Assistant:

LOCAL(void)
emit_restart (j_compress_ptr cinfo, int restart_num)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  int ci;
  jpeg_component_info * compptr;

  finish_pass(cinfo);

  emit_byte(0xFF, cinfo);
  emit_byte(JPEG_RST0 + restart_num, cinfo);

  /* Re-initialize statistics areas */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    /* DC needs no table for refinement scan */
    if (cinfo->Ss == 0 && cinfo->Ah == 0) {
      MEMZERO(entropy->dc_stats[compptr->dc_tbl_no], DC_STAT_BINS);
      /* Reset DC predictions to 0 */
      entropy->last_dc_val[ci] = 0;
      entropy->dc_context[ci] = 0;
    }
    /* AC needs no table when not present */
    if (cinfo->Se) {
      MEMZERO(entropy->ac_stats[compptr->ac_tbl_no], AC_STAT_BINS);
    }
  }

  /* Reset arithmetic encoding variables */
  entropy->c = 0;
  entropy->a = 0x10000L;
  entropy->sc = 0;
  entropy->zc = 0;
  entropy->ct = 11;
  entropy->buffer = -1;  /* empty */
}